

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Lodtalk::MethodCompiler::generateIfElse
          (MethodCompiler *this,MessageSendNode *node,Oop trueValue,Node *receiver,Node *trueBranch,
          Node *falseBranch,bool negated)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  anon_union_8_4_0eb573b0_for_Oop_0 local_68;
  anon_union_8_4_0eb573b0_for_Oop_0 local_60;
  undefined8 local_58;
  Label *local_50;
  Label *mergeLabel;
  Label *elseLabel;
  Node *pNStack_38;
  bool negated_local;
  Node *falseBranch_local;
  Node *trueBranch_local;
  Node *receiver_local;
  MessageSendNode *node_local;
  MethodCompiler *this_local;
  Oop trueValue_local;
  
  elseLabel._7_1_ = negated;
  pNStack_38 = falseBranch;
  falseBranch_local = trueBranch;
  trueBranch_local = receiver;
  receiver_local = &node->super_Node;
  node_local = (MessageSendNode *)this;
  this_local = (MethodCompiler *)trueValue.field_0;
  mergeLabel = MethodAssembler::Assembler::makeLabel(&this->gen);
  local_50 = MethodAssembler::Assembler::makeLabel(&this->gen);
  iVar2 = (*trueBranch_local->_vptr_Node[2])(trueBranch_local,this);
  local_58 = CONCAT44(extraout_var,iVar2);
  local_60 = (anon_union_8_4_0eb573b0_for_Oop_0)trueOop();
  bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_60);
  if (bVar1) {
    MethodAssembler::Assembler::jumpOnFalse(&this->gen,mergeLabel);
  }
  else {
    local_68 = (anon_union_8_4_0eb573b0_for_Oop_0)falseOop();
    bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_68);
    if (bVar1) {
      MethodAssembler::Assembler::jumpOnTrue(&this->gen,mergeLabel);
    }
    else {
      MethodAssembler::Assembler::pushLiteral(&this->gen,(Oop)this_local);
      MethodAssembler::Assembler::identityEqual(&this->gen);
      if ((elseLabel._7_1_ & 1) == 0) {
        MethodAssembler::Assembler::jumpOnFalse(&this->gen,mergeLabel);
      }
      else {
        MethodAssembler::Assembler::jumpOnTrue(&this->gen,mergeLabel);
      }
    }
  }
  (*falseBranch_local->_vptr_Node[2])(falseBranch_local,this);
  uVar3 = (*falseBranch_local->_vptr_Node[5])();
  if ((uVar3 & 1) == 0) {
    MethodAssembler::Assembler::sendValue(&this->gen);
  }
  MethodAssembler::Assembler::jump(&this->gen,local_50);
  MethodAssembler::Assembler::putLabel(&this->gen,mergeLabel);
  if (pNStack_38 == (Node *)0x0) {
    MethodAssembler::Assembler::pushNil(&this->gen);
  }
  else {
    (*pNStack_38->_vptr_Node[2])(pNStack_38,this);
    uVar3 = (*pNStack_38->_vptr_Node[5])();
    if ((uVar3 & 1) == 0) {
      MethodAssembler::Assembler::sendValue(&this->gen);
    }
  }
  MethodAssembler::Assembler::putLabel(&this->gen,local_50);
  return;
}

Assistant:

void MethodCompiler::generateIfElse(MessageSendNode *node, Oop trueValue, Node *receiver, Node *trueBranch, Node *falseBranch, bool negated)
{
    auto elseLabel = gen.makeLabel();
    auto mergeLabel = gen.makeLabel();

    // Evaluate the condition.
    receiver->acceptVisitor(this);

    // Compare the condition to the true value.
    if(trueValue == trueOop())
    {
        gen.jumpOnFalse(elseLabel);
    }
    else if(trueValue == falseOop())
    {
        gen.jumpOnTrue(elseLabel);
    }
    else
    {
        gen.pushLiteral(trueValue);
        gen.identityEqual();
        if(negated)
            gen.jumpOnTrue(elseLabel);
        else
            gen.jumpOnFalse(elseLabel);
    }

    // Generate the true branch.
    trueBranch->acceptVisitor(this);
    if(!trueBranch->isBlockExpression())
        gen.sendValue();
    gen.jump(mergeLabel);

    // Generate the false branch.
    gen.putLabel(elseLabel);
    if(falseBranch)
    {
        falseBranch->acceptVisitor(this);
        if(!falseBranch->isBlockExpression())
            gen.sendValue();
    }
    else
        gen.pushNil();

    // Merge the control flow.
    gen.putLabel(mergeLabel);
}